

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_biquad_clear_cache(ma_biquad *pBQ)

{
  if (pBQ != (ma_biquad *)0x0) {
    pBQ->pR1->f32 = 0.0;
    pBQ->pR2->f32 = 0.0;
    return MA_SUCCESS;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_biquad_clear_cache(ma_biquad* pBQ)
{
    if (pBQ == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pBQ->format == ma_format_f32) {
        pBQ->pR1->f32 = 0;
        pBQ->pR2->f32 = 0;
    } else {
        pBQ->pR1->s32 = 0;
        pBQ->pR2->s32 = 0;
    }

    return MA_SUCCESS;
}